

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img2webp.c
# Opt level: O0

int SetLoopCount(int loop_count,WebPData *webp_data)

{
  WebPMuxError WVar1;
  WebPMux *pWVar2;
  undefined4 in_EDI;
  WebPMux *mux;
  WebPData *in_stack_00000010;
  WebPMuxAnimParams new_params;
  uint32_t features;
  WebPMuxError err;
  int ok;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  WebPData *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  uint local_4;
  
  pWVar2 = WebPMuxCreate(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  if (pWVar2 == (WebPMux *)0x0) {
    local_4 = 0;
  }
  else {
    WVar1 = WebPMuxGetFeatures((WebPMux *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (uint32_t *)0x10561d);
    local_4 = (uint)(WVar1 == WEBP_MUX_OK);
    if ((local_4 != 0) && ((in_stack_ffffffffffffffe4 & 2) != 0)) {
      WVar1 = WebPMuxGetAnimationParams
                        ((WebPMux *)(ulong)CONCAT14(WVar1 == WEBP_MUX_OK,WVar1),
                         (WebPMuxAnimParams *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      local_4 = (uint)(WVar1 == WEBP_MUX_OK);
      if (local_4 != 0) {
        WVar1 = WebPMuxSetAnimationParams
                          ((WebPMux *)(ulong)CONCAT14(WVar1 == WEBP_MUX_OK,WVar1),
                           (WebPMuxAnimParams *)CONCAT44(in_stack_ffffffffffffffe4,in_EDI));
        local_4 = (uint)(WVar1 == WEBP_MUX_OK);
      }
      if (local_4 != 0) {
        WebPDataClear((WebPData *)0x1056b2);
        WVar1 = WebPMuxAssemble(stack0x00000018,in_stack_00000010);
        local_4 = (uint)(WVar1 == WEBP_MUX_OK);
      }
    }
    WebPMuxDelete((WebPMux *)0x1056e2);
    if (local_4 == 0) {
      fprintf(_stderr,"Error during loop-count setting\n");
    }
  }
  return local_4;
}

Assistant:

static int SetLoopCount(int loop_count, WebPData* const webp_data) {
  int ok = 1;
  WebPMuxError err;
  uint32_t features;
  WebPMuxAnimParams new_params;
  WebPMux* const mux = WebPMuxCreate(webp_data, 1);
  if (mux == NULL) return 0;

  err = WebPMuxGetFeatures(mux, &features);
  ok = (err == WEBP_MUX_OK);
  if (!ok || !(features & ANIMATION_FLAG)) goto End;

  err = WebPMuxGetAnimationParams(mux, &new_params);
  ok = (err == WEBP_MUX_OK);
  if (ok) {
    new_params.loop_count = loop_count;
    err = WebPMuxSetAnimationParams(mux, &new_params);
    ok = (err == WEBP_MUX_OK);
  }
  if (ok) {
    WebPDataClear(webp_data);
    err = WebPMuxAssemble(mux, webp_data);
    ok = (err == WEBP_MUX_OK);
  }

 End:
  WebPMuxDelete(mux);
  if (!ok) {
    fprintf(stderr, "Error during loop-count setting\n");
  }
  return ok;
}